

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayOrListLengthBinaryBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference pvVar2;
  pointer pEVar3;
  reference pvVar4;
  LogicalType *other;
  pointer pAVar5;
  ParameterNotResolvedException *this_00;
  BinderException *this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ArrayLengthBinaryFunctionData_*,_false> local_68;
  LogicalType type;
  vector<long,_true> dimensions;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
  if ((char)iVar1 == '\0') {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    if ((pEVar3->return_type).id_ != UNKNOWN) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      LogicalType::LogicalType(&type,&pEVar3->return_type);
      if (type.id_ == LIST) {
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,ListLengthBinaryFunction);
        pvVar4 = vector<duckdb::LogicalType,_true>::get<true>
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,0);
        LogicalType::operator=(pvVar4,&type);
        *(undefined8 *)this = 0;
      }
      else {
        if (type.id_ != ARRAY) {
          this_01 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&dimensions,"array_length can only be used on arrays or lists",
                     (allocator *)&local_68);
          BinderException::BinderException(this_01,(string *)&dimensions);
          __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar4 = vector<duckdb::LogicalType,_true>::get<true>
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,0);
        LogicalType::operator=(pvVar4,&type);
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,ArrayLengthBinaryFunction);
        dimensions.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        dimensions.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        dimensions.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        while (type.id_ == ARRAY) {
          local_68._M_head_impl = (ArrayLengthBinaryFunctionData *)ArrayType::GetSize(&type);
          ::std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    (&dimensions.super_vector<long,_std::allocator<long>_>,(long *)&local_68);
          other = ArrayType::GetChildType(&type);
          LogicalType::operator=(&type,other);
        }
        make_uniq<duckdb::ArrayLengthBinaryFunctionData>();
        pAVar5 = unique_ptr<duckdb::ArrayLengthBinaryFunctionData,_std::default_delete<duckdb::ArrayLengthBinaryFunctionData>,_true>
                 ::operator->((unique_ptr<duckdb::ArrayLengthBinaryFunctionData,_std::default_delete<duckdb::ArrayLengthBinaryFunctionData>,_true>
                               *)&local_68);
        ::std::vector<long,_std::allocator<long>_>::operator=
                  (&(pAVar5->dimensions).super_vector<long,_std::allocator<long>_>,
                   &dimensions.super_vector<long,_std::allocator<long>_>);
        *(ArrayLengthBinaryFunctionData **)this = local_68._M_head_impl;
        ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&dimensions);
      }
      LogicalType::~LogicalType(&type);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_00);
  __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> ArrayOrListLengthBinaryBind(ClientContext &context, ScalarFunction &bound_function,
                                                            vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	auto type = arguments[0]->return_type;
	if (type.id() == LogicalTypeId::ARRAY) {
		bound_function.arguments[0] = type;
		bound_function.function = ArrayLengthBinaryFunction;

		// If the input is an array, the dimensions are constant, so we can calculate them at bind time
		vector<int64_t> dimensions;
		while (true) {
			if (type.id() == LogicalTypeId::ARRAY) {
				dimensions.push_back(UnsafeNumericCast<int64_t>(ArrayType::GetSize(type)));
				type = ArrayType::GetChildType(type);
			} else {
				break;
			}
		}
		auto data = make_uniq<ArrayLengthBinaryFunctionData>();
		data->dimensions = dimensions;
		return std::move(data);

	} else if (type.id() == LogicalTypeId::LIST) {
		bound_function.function = ListLengthBinaryFunction;
		bound_function.arguments[0] = type;
		return nullptr;
	} else {
		// Unreachable
		throw BinderException("array_length can only be used on arrays or lists");
	}
}